

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

bool __thiscall
ddd::DaTrie<true,_true,_true>::search_prefix(DaTrie<true,_true,_true> *this,Query *query)

{
  pointer pBVar1;
  bool bVar2;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Bc BVar7;
  uint32_t uVar8;
  ulong uVar3;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar7 = pBVar1[query->node_pos_];
  uVar6 = BVar7._0_4_;
  uVar3 = (ulong)BVar7 >> 0x1f & 1;
  bVar2 = SUB81(uVar3,0);
  if ((int)uVar6 < 0) {
LAB_00126c56:
    query->value_ = uVar6 & 0x7fffffff;
  }
  else if (uVar6 != 0x7fffffff) {
    uVar5 = (ulong)query->node_pos_;
    uVar8 = query->pos_;
    do {
      uVar4 = (uint)(byte)query->key_[uVar8] ^ BVar7._0_4_;
      if ((*(uint *)&pBVar1[uVar4].field_0x4 & 0x7fffffff) != (uint)uVar5) {
        return SUB81(uVar3,0);
      }
      query->node_pos_ = uVar4;
      query->pos_ = uVar8 + 1;
      query->is_finished_ = query->key_[uVar8] == '\0';
      BVar7 = pBVar1[uVar4];
      uVar6 = BVar7._0_4_;
      uVar3 = (ulong)BVar7 >> 0x1f & 1;
      bVar2 = SUB81(uVar3,0);
      if ((int)uVar6 < 0) goto LAB_00126c56;
      uVar5 = (ulong)uVar4;
      uVar8 = uVar8 + 1;
    } while (uVar6 != 0x7fffffff);
  }
  return bVar2;
}

Assistant:

bool search_prefix(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto base = bc_[query.node_pos()].base();
      if (base == INVALID_VALUE) {
        return false;
      }
      auto child_pos = base ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    query.set_value(bc_[query.node_pos()].value());
    return true;
  }